

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O2

void __thiscall CTcSrcFile::CTcSrcFile(CTcSrcFile *this,osfildef *fp,CCharmapToUni *mapper)

{
  CVmDataSource *pCVar1;
  
  (this->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_0030df30;
  pCVar1 = (CVmDataSource *)operator_new(0x10);
  pCVar1->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_0030e008;
  pCVar1[1]._vptr_CVmDataSource = (_func_int **)fp;
  this->fp_ = pCVar1;
  this->field_0x8 = this->field_0x8 & 0xfe;
  this->rem_ = 0;
  this->mapper_ = mapper;
  return;
}

Assistant:

CTcSrcFile::CTcSrcFile(osfildef *fp, class CCharmapToUni *mapper)
{
    /* remember my source file */
    fp_ = new CVmFileSource(fp);

    /* net yet at end of file */
    at_eof_ = FALSE;
    
    /* there's no data in the buffer yet */
    rem_ = 0;
    
    /* remember my character mapper */
    mapper_ = mapper;
}